

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

uint64_t __thiscall leveldb::Table::ApproximateOffsetOf(Table *this,Slice *key)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Iterator *this_00;
  undefined4 extraout_var;
  uint64_t uVar4;
  undefined8 in_RSI;
  Status *in_RDI;
  Status s;
  Slice input;
  BlockHandle handle;
  uint64_t result;
  Iterator *index_iter;
  Status local_48;
  undefined8 local_40;
  BlockHandle local_30;
  Slice *in_stack_ffffffffffffffe0;
  Block *in_stack_ffffffffffffffe8;
  
  this_00 = Block::NewIterator(in_stack_ffffffffffffffe8,(Comparator *)in_stack_ffffffffffffffe0);
  (*this_00->_vptr_Iterator[5])(this_00,in_RSI);
  uVar2 = (*this_00->_vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    uVar4 = BlockHandle::offset((BlockHandle *)(in_RDI->state_ + 0x888));
  }
  else {
    BlockHandle::BlockHandle(&local_30);
    iVar3 = (*this_00->_vptr_Iterator[9])();
    local_40 = CONCAT44(extraout_var,iVar3);
    BlockHandle::DecodeFrom((BlockHandle *)this_00,in_stack_ffffffffffffffe0);
    bVar1 = Status::ok(&local_48);
    if (bVar1) {
      uVar4 = BlockHandle::offset(&local_30);
    }
    else {
      uVar4 = BlockHandle::offset((BlockHandle *)(in_RDI->state_ + 0x888));
    }
    Status::~Status(in_RDI);
  }
  if (this_00 != (Iterator *)0x0) {
    (*this_00->_vptr_Iterator[1])();
  }
  return uVar4;
}

Assistant:

uint64_t Table::ApproximateOffsetOf(const Slice& key) const {
  Iterator* index_iter =
      rep_->index_block->NewIterator(rep_->options.comparator);
  index_iter->Seek(key);
  uint64_t result;
  if (index_iter->Valid()) {
    BlockHandle handle;
    Slice input = index_iter->value();
    Status s = handle.DecodeFrom(&input);
    if (s.ok()) {
      result = handle.offset();
    } else {
      // Strange: we can't decode the block handle in the index block.
      // We'll just return the offset of the metaindex block, which is
      // close to the whole file size for this case.
      result = rep_->metaindex_handle.offset();
    }
  } else {
    // key is past the last key in the file.  Approximate the offset
    // by returning the offset of the metaindex block (which is
    // right near the end of the file).
    result = rep_->metaindex_handle.offset();
  }
  delete index_iter;
  return result;
}